

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gui.test.cpp
# Opt level: O3

void testRgbToHsv(Vector3f *rgb)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ostream *poVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vector3f VVar11;
  float local_88 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  Vector3f local_40;
  
  fVar1 = rgb->x;
  fVar2 = rgb->y;
  fVar7 = rgb->z;
  fVar10 = fVar2;
  fVar8 = fVar7;
  if (fVar7 <= fVar2) {
    fVar10 = fVar7;
    fVar8 = fVar2;
  }
  fVar9 = (float)(-(uint)(fVar2 < fVar7) & 0xbf800000);
  fVar7 = fVar1;
  fVar2 = fVar8;
  if (fVar8 <= fVar1) {
    fVar7 = fVar8;
    fVar2 = fVar1;
  }
  fVar6 = fVar7;
  if (fVar10 <= fVar7) {
    fVar6 = fVar10;
  }
  fVar10 = ABS((fVar7 - fVar10) / ((fVar2 - fVar6) * 6.0 + 1e-20) +
               (float)(-(uint)(fVar1 < fVar8) & (uint)(-0.33333334 - fVar9) |
                      ~-(uint)(fVar1 < fVar8) & (uint)fVar9));
  local_78 = ZEXT416((uint)fVar2);
  fVar7 = (fVar2 - fVar6) / (fVar2 + 1e-20);
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  local_88[2] = 0.0;
  ImGui::ColorConvertHSVtoRGB(fVar10,fVar7,fVar2,local_88,local_88 + 1,local_88 + 2);
  local_40 = convertRgbToHsv(rgb);
  fVar8 = local_40.z;
  VVar11 = convertHsvToRgb(&local_40);
  uVar3 = rgb->x;
  uVar4 = rgb->y;
  local_68 = ZEXT416((uint)(ABS(rgb->z - local_88[2]) +
                           ABS((float)uVar4 - SUB84(local_88._0_8_,4)) +
                           ABS((float)uVar3 - (float)local_88._0_8_)));
  local_58 = ZEXT416((uint)(ABS(rgb->z - VVar11.z) +
                           ABS((float)uVar4 - VVar11.y) + ABS((float)uVar3 - VVar11.x)));
  *(undefined8 *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"rgb(",4);
  *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)rgb->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)rgb->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)rgb->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") -> hsv(",9);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)fVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)fVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)(float)local_78._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"), err = ",9);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)(float)local_68._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", myErr = ",10);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)(float)local_58._0_4_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  fVar1 = local_40.x;
  fVar2 = local_40.y;
  if (((ABS(fVar10 - local_40.x) < 1e-06) && (ABS(fVar7 - local_40.y) < 1e-06)) &&
     (ABS((float)local_78._0_4_ - fVar8) < 1e-06)) {
    return;
  }
  *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)) = 0x38;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MISMATCH: got myHsv(",0x14);
  *(undefined8 *)(std::ostream::_M_insert<double> + *(long *)(std::cout + -0x18)) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)fVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
  *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 0xd;
  poVar5 = std::ostream::_M_insert<double>((double)fVar8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,")\n",2);
  return;
}

Assistant:

void testRgbToHsv(const sf::Vector3f& rgb) {
    sf::Vector3f hsv;
    ImGui::ColorConvertRGBtoHSV(rgb.x, rgb.y, rgb.z, hsv.x, hsv.y, hsv.z);
    sf::Vector3f rgb2;
    ImGui::ColorConvertHSVtoRGB(hsv.x, hsv.y, hsv.z, rgb2.x, rgb2.y, rgb2.z);

    sf::Vector3f myHsv = convertRgbToHsv(rgb);
    sf::Vector3f myRgb2 = convertHsvToRgb(myHsv);

    float err = findTotalError(rgb, rgb2);
    float myErr = findTotalError(rgb, myRgb2);

    std::cout << std::setprecision(10);
    std::cout << "rgb(" << std::setw(13) << rgb.x << ", " << std::setw(13) << rgb.y << ", " << std::setw(13) << rgb.z
        << ") -> hsv(" << std::setw(13) << hsv.x << ", " << std::setw(13) << hsv.y << ", " << std::setw(13) << hsv.z
        << "), err = " << std::setw(13) << err << ", myErr = " << std::setw(13) << myErr << "\n";

    if (floatEqual(hsv.x, myHsv.x) && floatEqual(hsv.y, myHsv.y) && floatEqual(hsv.z, myHsv.z)) {
    } else {
        std::cout << std::setw(56) << "MISMATCH: got myHsv(" << std::setw(13) << myHsv.x << ", " << std::setw(13) << myHsv.y << ", " << std::setw(13) << myHsv.z << ")\n";
        assert(false);
    }
    assert(floatEqual(err, 0.0f));
    assert(floatEqual(myErr, 0.0f));
}